

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

int compareStringsInUtf8(QUtf8StringView lhs,QStringView rhs,Comparison mode)

{
  qsizetype qVar1;
  const_pointer pvVar2;
  qsizetype qVar3;
  storage_type_conflict *psVar4;
  char16_t *ptr_00;
  int in_R8D;
  long in_FS_OFFSET;
  qptrdiff n;
  int r;
  char16_t uc;
  qsizetype len2;
  qptrdiff idx1;
  int diff;
  char16_t *end2;
  uchar *src1;
  qsizetype len1;
  uchar *ptr;
  char16_t *src2;
  uchar utf8 [4];
  char16_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint in_stack_ffffffffffffff68;
  uint uVar5;
  int in_stack_ffffffffffffff6c;
  storage_type_conflict *end;
  long local_70;
  int local_44;
  storage_type_conflict *local_38;
  QStringView local_30;
  QBasicUtf8StringView<false> local_20;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QBasicUtf8StringView<false>::size(&local_20);
  pvVar2 = QBasicUtf8StringView<false>::data(&local_20);
  local_38 = QStringView::utf16(&local_30);
  end = local_38;
  qVar3 = QStringView::size(&local_30);
  psVar4 = end + qVar3;
  local_70 = 0;
  do {
    local_c = 0xaaaaaaaa;
    local_38 = local_38 + 1;
    in_stack_ffffffffffffff6c =
         QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
                   ((char16_t)((ulong)end >> 0x10),
                    (uchar **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (char16_t **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
    ptr_00 = (char16_t *)0x0;
    if (qVar1 - local_70 < 0) {
      local_44 = -1;
      goto LAB_004780e4;
    }
    local_44 = memcmp(pvVar2 + local_70,&local_c,0);
    local_70 = (long)ptr_00 + local_70;
    uVar5 = in_stack_ffffffffffffff68 & 0xffffff;
    if ((local_44 == 0) && (uVar5 = in_stack_ffffffffffffff68 & 0xffffff, local_70 < qVar1)) {
      uVar5 = CONCAT13(local_38 < psVar4,(int3)in_stack_ffffffffffffff68);
    }
    in_stack_ffffffffffffff68 = uVar5;
  } while ((char)(uVar5 >> 0x18) != '\0');
  if ((in_R8D != 0) || (local_44 == 0)) {
    if ((local_70 == qVar1) == (local_38 == psVar4)) {
      qVar3 = stringLengthInUtf8(ptr_00,end);
      if ((qVar1 != qVar3) && (local_44 = 1, qVar1 < qVar3)) {
        local_44 = -1;
      }
    }
    else {
      local_44 = 1;
      if (local_70 == qVar1) {
        local_44 = -1;
      }
    }
  }
LAB_004780e4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

static int compareStringsInUtf8(QUtf8StringView lhs, QStringView rhs, Comparison mode) noexcept
{
    // CBOR requires that the shortest of the two strings be sorted first, so
    // we have to calculate the UTF-8 length of the UTF-16 string while
    // comparing. Unlike the UTF-32 comparison above, we convert the UTF-16
    // string to UTF-8 so we only need to decode one string.

    const qsizetype len1 = lhs.size();
    const auto src1 = reinterpret_cast<const uchar *>(lhs.data());
    const char16_t *src2 = rhs.utf16();
    const char16_t *const end2 = src2 + rhs.size();

    // Compare the two strings until we find a difference.
    int diff = 0;
    qptrdiff idx1 = 0;
    qsizetype len2 = 0;
    do {
        uchar utf8[4];      // longest possible Unicode character in UTF-8
        uchar *ptr = utf8;
        char16_t uc = *src2++;
        int r = QUtf8Functions::toUtf8<QUtf8BaseTraits>(uc, ptr, src2, end2);
        Q_UNUSED(r);    // ignore failure to encode proper UTF-16 surrogates

        qptrdiff n = ptr - utf8;
        len2 += n;
        if (len1 - idx1 < n)
            return -1;      // lhs is definitely shorter
        diff = memcmp(src1 + idx1, utf8, n);
        idx1 += n;
    } while (diff == 0 && idx1 < len1 && src2 < end2);

    if (mode == Comparison::ForEquality && diff)
        return diff;
    if ((idx1 == len1) != (src2 == end2)) {
        // One of the strings ended earlier than the other
        return idx1 == len1 ? -1 : 1;
    }

    // We found a difference and neither string ended, so continue calculating
    // the UTF-8 length of rhs.
    len2 += stringLengthInUtf8(src2, end2);

    if (len1 != len2)
        return len1 < len2 ? -1 : 1;
    return diff;
}